

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O0

basic_endpoint<boost::asio::ip::udp> * __thiscall
libtorrent::aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
          (basic_endpoint<boost::asio::ip::udp> *__return_storage_ptr__,aux *this,char **in)

{
  uint16_t port_num;
  address_v4 local_3c;
  undefined1 local_38 [2];
  uint16_t port;
  address addr;
  char **in_local;
  
  addr.ipv6_address_.scope_id_ = (unsigned_long)this;
  read_v4_address<char*&>((aux *)&local_3c,(char **)this);
  boost::asio::ip::address::address((address *)local_38,&local_3c);
  port_num = read_uint16<char*>((char **)addr.ipv6_address_.scope_id_);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (__return_storage_ptr__,(address *)local_38,port_num);
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v4_endpoint(InIt&& in)
	{
		address addr = read_v4_address(in);
		std::uint16_t port = read_uint16(in);
		return Endpoint(addr, port);
	}